

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O2

void __thiscall MeCab::CharProperty::CharProperty(CharProperty *this)

{
  Mmap<char> *this_00;
  
  this->_vptr_CharProperty = (_func_int **)&PTR__CharProperty_0016bba8;
  this_00 = (Mmap<char> *)operator_new(0x1d8);
  Mmap<char>::Mmap(this_00);
  (this->cmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0016bbd8;
  (this->cmmap_).ptr_ = this_00;
  (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->map_ = (CharInfo *)0x0;
  this->charset_ = 0;
  whatlog::whatlog(&this->what_);
  return;
}

Assistant:

CharProperty(): cmmap_(new Mmap<char>), map_(0), charset_(0) {}